

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O0

_Bool DUI_Button(char *text)

{
  size_t sVar1;
  char *in_RDI;
  _Bool clicked;
  _Bool hover;
  SDL_Rect bounds;
  int height;
  int width;
  byte local_34;
  bool local_33;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  char *local_18;
  int *local_10;
  SDL_Point *local_8;
  
  local_18 = in_RDI;
  sVar1 = strlen(in_RDI);
  local_28 = (int)sVar1 * _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_24 = _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_30 = _duiCursor.x;
  local_2c = _duiCursor.y;
  local_8 = &_duiMouse;
  local_10 = &local_30;
  local_33 = false;
  if (((_duiCursor.x <= _duiMouse.x) && (local_33 = false, _duiMouse.x < _duiCursor.x + local_28))
     && (local_33 = false, _duiCursor.y <= _duiMouse.y)) {
    local_33 = _duiMouse.y < _duiCursor.y + local_24;
  }
  local_34 = 0;
  if (local_33) {
    local_34 = _duiClicked;
  }
  local_20 = local_24;
  local_1c = local_28;
  if (local_33) {
    DUI_setColorHover();
  }
  else {
    DUI_setColorDefault();
  }
  SDL_RenderFillRect(_duiRenderer,&local_30);
  DUI_setColorBorder();
  SDL_RenderDrawRect(_duiRenderer,&local_30);
  _duiCursor.x = _duiStyle.ButtonPadding + _duiCursor.x;
  _duiCursor.y = _duiStyle.ButtonPadding + _duiCursor.y;
  DUI_Print("%s",local_18);
  _duiCursor.x = local_30 + local_28 + _duiStyle.ButtonMargin;
  _duiCursor.y = local_2c;
  return (_Bool)(local_34 & 1);
}

Assistant:

bool DUI_Button(const char * text)
{
    int width = (strlen(text) * _duiStyle.CharSize) 
        + (_duiStyle.ButtonPadding * 2);

    int height = _duiStyle.CharSize 
        + (_duiStyle.ButtonPadding * 2);

    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    bool hover = SDL_PointInRect(&_duiMouse, &bounds);
    bool clicked = (hover && _duiClicked);

    if (hover) {
        DUI_setColorHover();
    }
    else {
        DUI_setColorDefault();
    }

    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    _duiCursor.x += _duiStyle.ButtonPadding;
    _duiCursor.y += _duiStyle.ButtonPadding;

    DUI_Print("%s", text);

    _duiCursor.x = bounds.x + bounds.w + _duiStyle.ButtonMargin;
    _duiCursor.y = bounds.y;

    return clicked;
}